

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmgram.cpp
# Opt level: O2

void __thiscall
CVmObjGramProd::insert_alt(CVmObjGramProd *this,vm_obj_id_t self,size_t idx,vmgram_alt_info *alt)

{
  long *plVar1;
  byte *pbVar2;
  char *pcVar3;
  long lVar4;
  ulong uVar5;
  
  ensure_alts(this,*(long *)((this->super_CVmObject).ext_ + 0x38) + 1,8);
  pcVar3 = (this->super_CVmObject).ext_;
  lVar4 = *(long *)(pcVar3 + 0x30);
  for (uVar5 = *(ulong *)(pcVar3 + 0x38); idx < uVar5; uVar5 = uVar5 - 1) {
    *(undefined8 *)(lVar4 + uVar5 * 8) = *(undefined8 *)(lVar4 + -8 + uVar5 * 8);
  }
  plVar1 = (long *)((this->super_CVmObject).ext_ + 0x38);
  *plVar1 = *plVar1 + 1;
  *(vmgram_alt_info **)(lVar4 + idx * 8) = alt;
  pbVar2 = (byte *)((this->super_CVmObject).ext_ + 0x14);
  *pbVar2 = *pbVar2 | 1;
  if (((alt->tok_cnt != 0) && (alt->toks->typ == '\x01')) && ((alt->toks->typinfo).prod_obj == self)
     ) {
    pbVar2 = (byte *)((this->super_CVmObject).ext_ + 0x14);
    *pbVar2 = *pbVar2 | 4;
  }
  return;
}

Assistant:

void CVmObjGramProd::insert_alt(
    vm_obj_id_t self, size_t idx, vmgram_alt_info *alt)
{
    /* make sure we have room for one more alternative */
    ensure_alts(get_ext()->alt_cnt_ + 1, 8);

    /* get the alt list */
    vmgram_alt_info **alts = get_ext()->alts_;

    /* open a hole in the array for the new alternative */
    for (size_t i = get_ext()->alt_cnt_ ; i > idx ; --i)
        alts[i] = alts[i-1];

    /* adjust the count */
    get_ext()->alt_cnt_ += 1;

    /* plug in the new alternative */
    alts[idx] = alt;

    /* we've been modified since load time */
    get_ext()->modified_ = TRUE;

    /* note if this adds a circular rule */
    if (alt->tok_cnt != 0
        && alt->toks->typ == VMGRAM_MATCH_PROD
        && alt->toks->typinfo.prod_obj == self)
        get_ext()->has_circular_alt = TRUE;
}